

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O0

void __thiscall
GuidedMeshNormalFiltering::getAllFaceNeighborGMNF
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,FaceNeighborType face_neighbor_type,
          double radius,bool include_central_face,
          vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          *all_face_neighbor)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  BaseHandle *this_00;
  reference this_01;
  FaceIter FVar4;
  FaceIter local_80 [2];
  undefined1 local_60 [8];
  FaceIter f_it;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  *all_face_neighbor_local;
  bool include_central_face_local;
  double radius_local;
  FaceNeighborType face_neighbor_type_local;
  TriMesh *mesh_local;
  GuidedMeshNormalFiltering *this_local;
  
  std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
            ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)&f_it.hnd_);
  FVar4 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  while( true ) {
    f_it.mesh_ = FVar4._8_8_;
    local_60 = (undefined1  [8])FVar4.mesh_;
    FVar4 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
    local_80[0] = FVar4;
    bVar1 = OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)local_60,local_80);
    if (!bVar1) break;
    if (face_neighbor_type == kVertexBased) {
      pvVar3 = OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
               ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                            *)local_60);
      getVertexBasedFaceNeighbor
                (this,mesh,(FaceHandle)(pvVar3->super_BaseHandle).idx_,
                 (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)&f_it.hnd_);
    }
    else if (face_neighbor_type == kRadiusBased) {
      pvVar3 = OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
               ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                            *)local_60);
      getRadiusBasedFaceNeighbor
                (this,mesh,(FaceHandle)(pvVar3->super_BaseHandle).idx_,radius,
                 (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)&f_it.hnd_);
    }
    if (include_central_face) {
      pvVar3 = OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
               ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                            *)local_60);
      std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::push_back
                ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)&f_it.hnd_,
                 pvVar3);
    }
    this_00 = &OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
               ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                             *)local_60)->super_BaseHandle;
    iVar2 = OpenMesh::BaseHandle::idx(this_00);
    this_01 = std::
              vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
              ::operator[](all_face_neighbor,(long)iVar2);
    std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::operator=
              (this_01,(vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                       &f_it.hnd_);
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)local_60,0);
    FVar4._8_8_ = f_it.mesh_;
    FVar4.mesh_ = (mesh_ptr)local_60;
  }
  std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~vector
            ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)&f_it.hnd_);
  return;
}

Assistant:

void GuidedMeshNormalFiltering::getAllFaceNeighborGMNF(TriMesh &mesh, MeshDenoisingBase::FaceNeighborType face_neighbor_type, double radius, bool include_central_face,
                                                       std::vector<std::vector<TriMesh::FaceHandle> > &all_face_neighbor)
{
    std::vector<TriMesh::FaceHandle> face_neighbor;
    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        if(face_neighbor_type == kVertexBased)
            getVertexBasedFaceNeighbor(mesh, *f_it, face_neighbor);
        else if(face_neighbor_type == kRadiusBased)
            getRadiusBasedFaceNeighbor(mesh, *f_it, radius, face_neighbor);

        if(include_central_face)
            face_neighbor.push_back(*f_it);
        all_face_neighbor[f_it->idx()] = face_neighbor;
    }
}